

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

EndTerm * new_end_term(Token *op,void *expr)

{
  Token *pTVar1;
  void *pvVar2;
  EndTerm *pEVar3;
  undefined8 *puVar4;
  
  pvVar2 = malloc(0x18);
  pEVar3 = (EndTerm *)require_not_null(pvVar2,"Failed to allocate space");
  pvVar2 = malloc(0x10);
  puVar4 = (undefined8 *)require_not_null(pvVar2,"Failed to allocate space");
  puVar4[1] = 0;
  *puVar4 = end_eval;
  pTVar1 = (Token *)puVar4[1];
  (pEVar3->node).eval = (eval_handler_)*puVar4;
  (pEVar3->node).token = pTVar1;
  pEVar3->expr = expr;
  return pEVar3;
}

Assistant:

EndTerm *new_end_term(Token *op, void *expr) {
    EndTerm *term = new(EndTerm);
    term->node = tree_node_(NULL, eval_handler(end_eval));
    term->expr = expr;
    return term;
}